

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set_variable.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalSetVariable::GetGlobalSinkState(PhysicalSetVariable *this,ClientContext *context)

{
  _func_int **in_RAX;
  
  make_uniq<duckdb::SetVariableGlobalState>();
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = in_RAX;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalSetVariable::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<SetVariableGlobalState>();
}